

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

uint __thiscall QPDFWriter::bytesNeeded(QPDFWriter *this,longlong n)

{
  undefined4 local_1c;
  longlong lStack_18;
  uint bytes;
  longlong n_local;
  QPDFWriter *this_local;
  
  local_1c = 0;
  for (lStack_18 = n; lStack_18 != 0; lStack_18 = lStack_18 >> 8) {
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

unsigned int
QPDFWriter::bytesNeeded(long long n)
{
    unsigned int bytes = 0;
    while (n) {
        ++bytes;
        n >>= 8;
    }
    return bytes;
}